

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_generate.cpp
# Opt level: O0

compile_errcode __thiscall ConstantDeclaration::Generate(ConstantDeclaration *this)

{
  SymbolName SVar1;
  compile_errcode cVar2;
  int local_20;
  SymbolName name;
  int correct_count;
  int ret;
  ConstantDeclaration *this_local;
  
  local_20 = 0;
  while( true ) {
    SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
    if (SVar1 != CONST_SYM) {
      if (local_20 < 1) {
        this_local._4_4_ = -1;
      }
      else {
        this_local._4_4_ = 0;
      }
      return this_local._4_4_;
    }
    cVar2 = ConstantDefinition::Generate(&this->m_constant_definition);
    if (cVar2 != 0) break;
    local_20 = local_20 + 1;
  }
  return -1;
}

Assistant:

compile_errcode ConstantDeclaration::Generate() {
    int ret = 0;
    int correct_count = 0;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        if (name == CONST_SYM) {
            if ((ret = m_constant_definition.Generate()) == COMPILE_OK) {
                correct_count++;
            } else {
                return NOT_MATCH;
            }
        } else {
            if (correct_count > 0)
                return COMPILE_OK;
            else
                return NOT_MATCH;
        }
    }
}